

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

int32 fe_compute_melcosine(melfb_t *mel_fb)

{
  mfcc_t **ppmVar1;
  ulong uVar2;
  mfcc_t *pmVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  ppmVar1 = (mfcc_t **)
            __ckd_calloc_2d__((long)mel_fb->num_cepstra,(long)mel_fb->num_filters,4,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/fe/fe_sigproc.c"
                              ,0x2b7);
  mel_fb->mel_cosine = ppmVar1;
  iVar4 = mel_fb->num_cepstra;
  uVar2 = (ulong)(uint)mel_fb->num_filters;
  dVar8 = (double)mel_fb->num_filters;
  if (0 < iVar4) {
    lVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar6 = 0;
        do {
          dVar7 = cos(((double)(int)lVar6 + 0.5) * (double)(int)lVar5 * (3.141592653589793 / dVar8))
          ;
          mel_fb->mel_cosine[lVar5][lVar6] = (mfcc_t)(float)dVar7;
          lVar6 = lVar6 + 1;
          uVar2 = (ulong)mel_fb->num_filters;
        } while (lVar6 < (long)uVar2);
        iVar4 = mel_fb->num_cepstra;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar4);
    dVar8 = (double)(int)uVar2;
  }
  dVar8 = 1.0 / dVar8;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  mel_fb->sqrt_inv_n = (mfcc_t)(float)dVar8;
  dVar8 = 2.0 / (double)mel_fb->num_filters;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  mel_fb->sqrt_inv_2n = (mfcc_t)(float)dVar8;
  if (mel_fb->lifter_val != 0) {
    iVar4 = mel_fb->num_cepstra;
    pmVar3 = (mfcc_t *)calloc((long)iVar4,4);
    mel_fb->lifter = pmVar3;
    if (0 < (long)iVar4) {
      lVar5 = 0;
      do {
        iVar4 = mel_fb->lifter_val;
        dVar8 = sin(((double)(int)lVar5 * 3.141592653589793) / (double)iVar4);
        mel_fb->lifter[lVar5] = (mfcc_t)(float)(dVar8 * (double)(iVar4 / 2) + 1.0);
        lVar5 = lVar5 + 1;
      } while (lVar5 < mel_fb->num_cepstra);
    }
  }
  return 0;
}

Assistant:

int32
fe_compute_melcosine(melfb_t * mel_fb)
{

    float64 freqstep;
    int32 i, j;

    mel_fb->mel_cosine =
        (mfcc_t **) ckd_calloc_2d(mel_fb->num_cepstra,
                                  mel_fb->num_filters, sizeof(mfcc_t));

    freqstep = M_PI / mel_fb->num_filters;
    /* NOTE: The first row vector is actually unnecessary but we leave
     * it in to avoid confusion. */
    for (i = 0; i < mel_fb->num_cepstra; i++) {
        for (j = 0; j < mel_fb->num_filters; j++) {
            float64 cosine;

            cosine = cos(freqstep * i * (j + 0.5));
            mel_fb->mel_cosine[i][j] = FLOAT2COS(cosine);
        }
    }

    /* Also precompute normalization constants for unitary DCT. */
    mel_fb->sqrt_inv_n = FLOAT2COS(sqrt(1.0 / mel_fb->num_filters));
    mel_fb->sqrt_inv_2n = FLOAT2COS(sqrt(2.0 / mel_fb->num_filters));

    /* And liftering weights */
    if (mel_fb->lifter_val) {
        mel_fb->lifter =
            calloc(mel_fb->num_cepstra, sizeof(*mel_fb->lifter));
        for (i = 0; i < mel_fb->num_cepstra; ++i) {
            mel_fb->lifter[i] = FLOAT2MFCC(1 + mel_fb->lifter_val / 2
                                           * sin(i * M_PI /
                                                 mel_fb->lifter_val));
        }
    }

    return (0);
}